

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

ChFrameMoving<double> * __thiscall
chrono::ChFrameMoving<double>::operator>>
          (ChFrameMoving<double> *__return_storage_ptr__,ChFrameMoving<double> *this,
          ChFrameMoving<double> *Fb)

{
  ChVector<double> local_58;
  ChQuaternion<double> local_38;
  
  local_58.m_data[2] = 0.0;
  local_38.m_data[0] = 1.0;
  local_38.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  ChFrameMoving(__return_storage_ptr__,&local_58,&local_38);
  TransformLocalToParent(Fb,this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ChFrameMoving<Real> operator>>(const ChFrameMoving<Real>& Fb) const {
        ChFrameMoving<Real> res;
        Fb.TransformLocalToParent(*this, res);
        return res;
    }